

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginDebugGroup
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Char *Name,float *pColor,
          int param_3)

{
  string msg;
  string local_30;
  
  if (Name == (Char *)0x0) {
    FormatString<char[22]>(&local_30,(char (*) [22])0x7f04ea);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"BeginDebugGroup",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x835);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_DvpDebugGroupCount = this->m_DvpDebugGroupCount + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::BeginDebugGroup(const Char* Name, const float* pColor, int)
{
    DEV_CHECK_ERR(Name != nullptr, "Name must not be null");
#ifdef DILIGENT_DEVELOPMENT
    ++m_DvpDebugGroupCount;
#endif
}